

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O3

int __thiscall tcu::abs(tcu *this,int __x)

{
  char *pcVar1;
  deRoundingMode dVar2;
  tcu tVar3;
  undefined4 in_register_00000034;
  tcu tVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_58;
  
  pcVar1 = (char *)CONCAT44(in_register_00000034,__x);
  dVar8 = *(double *)(CONCAT44(in_register_00000034,__x) + 8);
  dVar9 = *(double *)(CONCAT44(in_register_00000034,__x) + 0x10);
  if (dVar8 <= dVar9) {
    dVar2 = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    local_58 = ABS(dVar8);
    if (NAN(dVar8)) {
      local_58 = INFINITY;
    }
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    deSetRoundingMode(dVar2);
    dVar9 = *(double *)(pcVar1 + 0x10);
    dVar2 = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar7 = ABS(dVar9);
    if (NAN(dVar9)) {
      dVar7 = INFINITY;
    }
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    deSetRoundingMode(dVar2);
    tVar4 = (tcu)(NAN(dVar8) || NAN(dVar9));
    dVar8 = (double)(~-(ulong)NAN(dVar8) & (ulong)ABS(dVar8) |
                    -(ulong)NAN(dVar8) & 0xfff0000000000000);
    dVar9 = (double)(~-(ulong)NAN(dVar9) & (ulong)ABS(dVar9) |
                    -(ulong)NAN(dVar9) & 0xfff0000000000000);
    uVar6 = ~-(ulong)(local_58 <= dVar7) & (ulong)dVar7 |
            (ulong)local_58 & -(ulong)(local_58 <= dVar7);
    uVar5 = -(ulong)(dVar9 <= dVar8);
    dVar7 = (double)(~uVar5 & (ulong)dVar9 | uVar5 & (ulong)dVar8);
    dVar8 = *(double *)(pcVar1 + 8);
    dVar9 = *(double *)(pcVar1 + 0x10);
  }
  else {
    uVar6 = 0x7ff0000000000000;
    dVar7 = -INFINITY;
    tVar4 = (tcu)0x0;
  }
  if (dVar8 <= 0.0 && 0.0 <= dVar9) {
    dVar7 = (double)(~-(ulong)(dVar7 <= 0.0) & (ulong)dVar7);
    uVar6 = 0;
  }
  tVar3 = (tcu)0x1;
  if (*pcVar1 == '\0') {
    tVar3 = tVar4;
  }
  *this = tVar3;
  *(ulong *)(this + 8) = uVar6;
  *(double *)(this + 0x10) = dVar7;
  return (int)this;
}

Assistant:

Interval abs (const Interval& x)
{
	const Interval mono = applyMonotone(std::abs, x);

	if (x.contains(0.0))
		return Interval(0.0, mono);

	return mono;
}